

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O2

int VP8LDecodeImage(VP8LDecoder *dec)

{
  int src_height;
  int dst_width;
  int dst_height;
  VP8Io *io;
  undefined8 *puVar1;
  int iVar2;
  WEBP_CSP_MODE WVar3;
  WebPRescaler *rescaler;
  VP8StatusCode VVar4;
  
  if (dec == (VP8LDecoder *)0x0) {
    return 0;
  }
  io = dec->io_;
  puVar1 = (undefined8 *)io->opaque;
  if (dec->state_ == READ_DATA) {
LAB_0010c51a:
    iVar2 = DecodeImageData(dec,dec->pixels_,dec->width_,dec->height_,io->crop_bottom,ProcessRows);
    if (iVar2 != 0) {
      *(int *)(puVar1 + 4) = dec->last_out_row_;
      return 1;
    }
  }
  else {
    dec->output_ = (WebPDecBuffer *)*puVar1;
    iVar2 = WebPIoInitFromOptions((WebPDecoderOptions *)puVar1[5],io,MODE_BGRA);
    if (iVar2 == 0) {
      VVar4 = VP8_STATUS_INVALID_PARAM;
    }
    else {
      iVar2 = AllocateInternalBuffers32b(dec,io->width);
      if (iVar2 == 0) goto LAB_0010c55c;
      if (io->use_scaling == 0) {
LAB_0010c4b0:
        WVar3 = dec->output_->colorspace;
        if (0xfffffffb < WVar3 - MODE_YUV) goto LAB_0010c4be;
      }
      else {
        iVar2 = io->mb_w;
        src_height = io->mb_h;
        dst_width = io->scaled_width;
        dst_height = io->scaled_height;
        rescaler = (WebPRescaler *)WebPSafeMalloc((long)dst_width * 0x24 + 0x68,1);
        if (rescaler == (WebPRescaler *)0x0) {
          VVar4 = VP8_STATUS_OUT_OF_MEMORY;
          goto LAB_0010c559;
        }
        dec->rescaler_memory = (uint8_t *)rescaler;
        dec->rescaler = rescaler;
        iVar2 = WebPRescalerInit(rescaler,iVar2,src_height,
                                 (uint8_t *)(&rescaler[1].x_expand + (long)dst_width * 8),dst_width,
                                 dst_height,0,4,(rescaler_t *)(rescaler + 1));
        if (iVar2 == 0) goto LAB_0010c55c;
        if (io->use_scaling == 0) goto LAB_0010c4b0;
LAB_0010c4be:
        WebPInitAlphaProcessing();
        WVar3 = dec->output_->colorspace;
      }
      VVar4 = VP8_STATUS_OUT_OF_MEMORY;
      if ((MODE_rgbA_4444 < WVar3) &&
         (WebPInitConvertARGBToYUV(), (dec->output_->u).YUVA.a != (uint8_t *)0x0)) {
        WebPInitAlphaProcessing();
      }
      if ((((dec->incremental_ == 0) || ((dec->hdr_).color_cache_size_ < 1)) ||
          ((dec->hdr_).saved_color_cache_.colors_ != (uint32_t *)0x0)) ||
         (iVar2 = VP8LColorCacheInit(&(dec->hdr_).saved_color_cache_,
                                     (dec->hdr_).color_cache_.hash_bits_), iVar2 != 0)) {
        dec->state_ = READ_DATA;
        goto LAB_0010c51a;
      }
    }
LAB_0010c559:
    dec->status_ = VVar4;
  }
LAB_0010c55c:
  VP8LClear(dec);
  return 0;
}

Assistant:

int VP8LDecodeImage(VP8LDecoder* const dec) {
  VP8Io* io = NULL;
  WebPDecParams* params = NULL;

  if (dec == NULL) return 0;

  assert(dec->hdr_.huffman_tables_ != NULL);
  assert(dec->hdr_.htree_groups_ != NULL);
  assert(dec->hdr_.num_htree_groups_ > 0);

  io = dec->io_;
  assert(io != NULL);
  params = (WebPDecParams*)io->opaque;
  assert(params != NULL);

  // Initialization.
  if (dec->state_ != READ_DATA) {
    dec->output_ = params->output;
    assert(dec->output_ != NULL);

    if (!WebPIoInitFromOptions(params->options, io, MODE_BGRA)) {
      dec->status_ = VP8_STATUS_INVALID_PARAM;
      goto Err;
    }

    if (!AllocateInternalBuffers32b(dec, io->width)) goto Err;

#if !defined(WEBP_REDUCE_SIZE)
    if (io->use_scaling && !AllocateAndInitRescaler(dec, io)) goto Err;
#else
    if (io->use_scaling) {
      dec->status_ = VP8_STATUS_INVALID_PARAM;
      goto Err;
    }
#endif
    if (io->use_scaling || WebPIsPremultipliedMode(dec->output_->colorspace)) {
      // need the alpha-multiply functions for premultiplied output or rescaling
      WebPInitAlphaProcessing();
    }

    if (!WebPIsRGBMode(dec->output_->colorspace)) {
      WebPInitConvertARGBToYUV();
      if (dec->output_->u.YUVA.a != NULL) WebPInitAlphaProcessing();
    }
    if (dec->incremental_) {
      if (dec->hdr_.color_cache_size_ > 0 &&
          dec->hdr_.saved_color_cache_.colors_ == NULL) {
        if (!VP8LColorCacheInit(&dec->hdr_.saved_color_cache_,
                                dec->hdr_.color_cache_.hash_bits_)) {
          dec->status_ = VP8_STATUS_OUT_OF_MEMORY;
          goto Err;
        }
      }
    }
    dec->state_ = READ_DATA;
  }

  // Decode.
  if (!DecodeImageData(dec, dec->pixels_, dec->width_, dec->height_,
                       io->crop_bottom, ProcessRows)) {
    goto Err;
  }

  params->last_y = dec->last_out_row_;
  return 1;

 Err:
  VP8LClear(dec);
  assert(dec->status_ != VP8_STATUS_OK);
  return 0;
}